

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocmds.c
# Opt level: O3

LispPTR * alloc_mdspage(short type)

{
  ushort uVar1;
  LispPTR LVar2;
  uint uVar3;
  LispPTR *pLVar4;
  DLword *pDVar5;
  
  uVar1 = (ushort)*MDS_free_page_word;
  if (uVar1 == 0) {
    checkfor_storagefull(0);
    pLVar4 = (LispPTR *)(Lisp_world + (*Next_MDSpage_word << 8));
    pDVar5 = Lisp_world + ((ulong)(*Next_MDSpage_word << 8) - 0x200);
    Next_MDSpage = pDVar5;
    if (((ulong)pDVar5 & 1) != 0) {
      printf("Misaligned pointer in LPageFromNative %p\n",pDVar5);
    }
    *Next_MDSpage_word = (LispPTR)((ulong)((long)pDVar5 - (long)Lisp_world) >> 9);
    if (((ulong)pLVar4 & 1) != 0) {
      printf("Misaligned pointer in LAddrFromNative %p\n",pLVar4);
    }
    LVar2 = newpage((LispPTR)((ulong)((long)pLVar4 - (long)Lisp_world) >> 1));
    newpage(LVar2 + 0x100);
  }
  else {
    pLVar4 = (LispPTR *)(Lisp_world + (ulong)uVar1 * 0x100);
    uVar3 = *(uint *)(Lisp_world + (ulong)uVar1 * 0x100) & 0xffff;
    if (uVar3 != 0) {
      if ((*(ushort *)
            ((ulong)(*(uint *)(Lisp_world + (ulong)uVar1 * 0x100) >> 8 & 0xfffffffe) +
             (long)MDStypetbl ^ 2) & 0x7ff) != 1) {
        error("alloc_mdspage: Bad Free Page Link");
        goto LAB_00106d42;
      }
    }
    *MDS_free_page_word = uVar3 | 0xe0000;
  }
LAB_00106d42:
  if (((ulong)pLVar4 & 1) != 0) {
    printf("Misaligned pointer in LPageFromNative %p\n",pLVar4);
  }
  *(short *)((ulong)(uint)((int)((ulong)((long)pLVar4 - (long)Lisp_world) >> 10) * 2) +
             (long)MDStypetbl ^ 2) = type;
  return pLVar4;
}

Assistant:

LispPTR *alloc_mdspage(short int type) {
  LispPTR *ptr; /* points Top 32 bit of the MDS page */
  LispPTR next_page;

  /* Next_Array=(DLword *)NativeAligned2FromLAddr(((*Next_Array_word)& 0xffff ) << 8); */

  if (LOLOC(*MDS_free_page_word) != NIL) {
    ptr = (LispPTR *)NativeAligned4FromLPage(LOLOC(*MDS_free_page_word));

    if (((next_page = LOLOC(*ptr)) != 0) && (GetTypeNumber((*ptr)) != TYPE_SMALLP))
      error("alloc_mdspage: Bad Free Page Link");
    else {
      *MDS_free_page_word = S_POSITIVE | next_page;
    }
  } else {
    /* I guess Next_MDSpage is redundant */
    checkfor_storagefull(NIL);
#ifdef BIGVM
    Next_MDSpage = (DLword *)NativeAligned2FromLAddr(((*Next_MDSpage_word)) << 8);
#else
    Next_MDSpage = (DLword *)NativeAligned2FromLAddr(((*Next_MDSpage_word) & 0xffff) << 8);
#endif
    ptr = (LispPTR *)Next_MDSpage;       /* Get Pointer to First Page */
    Next_MDSpage -= DLWORDSPER_PAGE * 2; /* decrement MDS count */
#ifdef BIGVM
    *Next_MDSpage_word = LPageFromNative(Next_MDSpage);
#else
    *Next_MDSpage_word = S_POSITIVE | LPageFromNative(Next_MDSpage);
#endif
    newpage(newpage(LAddrFromNative(ptr)) + DLWORDSPER_PAGE);
  }

  Make_MDSentry(LPageFromNative(ptr), type);
  return (ptr);
}